

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

void __thiscall
icu_63::CollationRuleParser::parseStarredCharacters
          (CollationRuleParser *this,int32_t strength,int32_t i,UErrorCode *errorCode)

{
  undefined1 *puVar1;
  Sink *pSVar2;
  UBool UVar3;
  char16_t cVar4;
  int32_t iVar5;
  int iVar6;
  undefined1 local_148 [8];
  UnicodeString s;
  undefined1 local_100 [4];
  UChar32 c;
  uint local_bc;
  int local_b8;
  UChar32 c_1;
  int32_t j;
  UChar32 prev;
  undefined1 local_a0 [8];
  UnicodeString raw;
  UnicodeString empty;
  UErrorCode *errorCode_local;
  int32_t i_local;
  int32_t strength_local;
  CollationRuleParser *this_local;
  
  UnicodeString::UnicodeString((UnicodeString *)((long)&raw.fUnion + 0x30));
  UnicodeString::UnicodeString((UnicodeString *)local_a0);
  iVar5 = skipWhiteSpace(this,i);
  errorCode_local._0_4_ = parseString(this,iVar5,(UnicodeString *)local_a0,errorCode);
  UVar3 = ::U_FAILURE(*errorCode);
  if (UVar3 == '\0') {
    UVar3 = UnicodeString::isEmpty((UnicodeString *)local_a0);
    if (UVar3 == '\0') {
      c_1 = -1;
      local_b8 = 0;
      do {
        for (; iVar6 = local_b8, iVar5 = UnicodeString::length((UnicodeString *)local_a0),
            iVar6 < iVar5; local_b8 = iVar6 + local_b8) {
          local_bc = UnicodeString::char32At((UnicodeString *)local_a0,local_b8);
          iVar6 = (*(this->nfd->super_UObject)._vptr_UObject[0x11])(this->nfd,(ulong)local_bc);
          if ((char)iVar6 == '\0') {
            setParseError(this,"starred-relation string is not all NFD-inert",errorCode);
            j = 1;
            goto LAB_002a657d;
          }
          pSVar2 = this->sink;
          UnicodeString::UnicodeString((UnicodeString *)local_100,local_bc);
          puVar1 = (undefined1 *)((long)&raw.fUnion + 0x30);
          (*(pSVar2->super_UObject)._vptr_UObject[4])
                    (pSVar2,(ulong)(uint)strength,puVar1,local_100,puVar1,&this->errorReason,
                     errorCode);
          UnicodeString::~UnicodeString((UnicodeString *)local_100);
          UVar3 = ::U_FAILURE(*errorCode);
          if (UVar3 != '\0') {
            setErrorContext(this);
            j = 1;
            goto LAB_002a657d;
          }
          iVar6 = 2;
          if (local_bc < 0x10000) {
            iVar6 = 1;
          }
          c_1 = local_bc;
        }
        iVar5 = UnicodeString::length(this->rules);
        if ((iVar5 <= (int32_t)errorCode_local) ||
           (cVar4 = UnicodeString::charAt(this->rules,(int32_t)errorCode_local), cVar4 != L'-')) {
          iVar5 = skipWhiteSpace(this,(int32_t)errorCode_local);
          this->ruleIndex = iVar5;
          j = 0;
          break;
        }
        if (c_1 < 0) {
          setParseError(this,"range without start in starred-relation string",errorCode);
          j = 1;
          break;
        }
        errorCode_local._0_4_ =
             parseString(this,(int32_t)errorCode_local + 1,(UnicodeString *)local_a0,errorCode);
        UVar3 = ::U_FAILURE(*errorCode);
        if (UVar3 != '\0') {
          j = 1;
          break;
        }
        UVar3 = UnicodeString::isEmpty((UnicodeString *)local_a0);
        if (UVar3 != '\0') {
          setParseError(this,"range without end in starred-relation string",errorCode);
          j = 1;
          break;
        }
        s.fUnion._52_4_ = UnicodeString::char32At((UnicodeString *)local_a0,0);
        if ((int)s.fUnion._52_4_ < c_1) {
          setParseError(this,"range start greater than end in starred-relation string",errorCode);
          j = 1;
          break;
        }
        UnicodeString::UnicodeString((UnicodeString *)local_148);
        do {
          c_1 = c_1 + 1;
          if ((int)s.fUnion._52_4_ < c_1) {
            c_1 = -1;
            local_b8 = 2;
            if ((uint)s.fUnion._52_4_ < 0x10000) {
              local_b8 = 1;
            }
            j = 0;
            goto LAB_002a652f;
          }
          iVar6 = (*(this->nfd->super_UObject)._vptr_UObject[0x11])(this->nfd,(ulong)(uint)c_1);
          if ((char)iVar6 == '\0') {
            setParseError(this,"starred-relation string range is not all NFD-inert",errorCode);
            j = 1;
            goto LAB_002a652f;
          }
          if ((c_1 & 0xfffff800U) == 0xd800) {
            setParseError(this,"starred-relation string range contains a surrogate",errorCode);
            j = 1;
            goto LAB_002a652f;
          }
          if ((0xfffc < c_1) && (c_1 < 0x10000)) {
            setParseError(this,"starred-relation string range contains U+FFFD, U+FFFE or U+FFFF",
                          errorCode);
            j = 1;
            goto LAB_002a652f;
          }
          UnicodeString::setTo((UnicodeString *)local_148,c_1);
          puVar1 = (undefined1 *)((long)&raw.fUnion + 0x30);
          (*(this->sink->super_UObject)._vptr_UObject[4])
                    (this->sink,(ulong)(uint)strength,puVar1,local_148,puVar1,&this->errorReason,
                     errorCode);
          UVar3 = ::U_FAILURE(*errorCode);
        } while (UVar3 == '\0');
        setErrorContext(this);
        j = 1;
LAB_002a652f:
        UnicodeString::~UnicodeString((UnicodeString *)local_148);
      } while (j == 0);
    }
    else {
      setParseError(this,"missing starred-relation string",errorCode);
      j = 1;
    }
  }
  else {
    j = 1;
  }
LAB_002a657d:
  UnicodeString::~UnicodeString((UnicodeString *)local_a0);
  UnicodeString::~UnicodeString((UnicodeString *)((long)&raw.fUnion + 0x30));
  return;
}

Assistant:

void
CollationRuleParser::parseStarredCharacters(int32_t strength, int32_t i, UErrorCode &errorCode) {
    UnicodeString empty, raw;
    i = parseString(skipWhiteSpace(i), raw, errorCode);
    if(U_FAILURE(errorCode)) { return; }
    if(raw.isEmpty()) {
        setParseError("missing starred-relation string", errorCode);
        return;
    }
    UChar32 prev = -1;
    int32_t j = 0;
    for(;;) {
        while(j < raw.length()) {
            UChar32 c = raw.char32At(j);
            if(!nfd.isInert(c)) {
                setParseError("starred-relation string is not all NFD-inert", errorCode);
                return;
            }
            sink->addRelation(strength, empty, UnicodeString(c), empty, errorReason, errorCode);
            if(U_FAILURE(errorCode)) {
                setErrorContext();
                return;
            }
            j += U16_LENGTH(c);
            prev = c;
        }
        if(i >= rules->length() || rules->charAt(i) != 0x2d) {  // '-'
            break;
        }
        if(prev < 0) {
            setParseError("range without start in starred-relation string", errorCode);
            return;
        }
        i = parseString(i + 1, raw, errorCode);
        if(U_FAILURE(errorCode)) { return; }
        if(raw.isEmpty()) {
            setParseError("range without end in starred-relation string", errorCode);
            return;
        }
        UChar32 c = raw.char32At(0);
        if(c < prev) {
            setParseError("range start greater than end in starred-relation string", errorCode);
            return;
        }
        // range prev-c
        UnicodeString s;
        while(++prev <= c) {
            if(!nfd.isInert(prev)) {
                setParseError("starred-relation string range is not all NFD-inert", errorCode);
                return;
            }
            if(U_IS_SURROGATE(prev)) {
                setParseError("starred-relation string range contains a surrogate", errorCode);
                return;
            }
            if(0xfffd <= prev && prev <= 0xffff) {
                setParseError("starred-relation string range contains U+FFFD, U+FFFE or U+FFFF", errorCode);
                return;
            }
            s.setTo(prev);
            sink->addRelation(strength, empty, s, empty, errorReason, errorCode);
            if(U_FAILURE(errorCode)) {
                setErrorContext();
                return;
            }
        }
        prev = -1;
        j = U16_LENGTH(c);
    }
    ruleIndex = skipWhiteSpace(i);
}